

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O1

void av1_superres_upscale(AV1_COMMON *cm,BufferPool *pool,_Bool alloc_pyramid)

{
  YV12_BUFFER_CONFIG *src_bc;
  uint8_t uVar1;
  int byte_alignment;
  SequenceHeader *pSVar2;
  RefCntBuffer *pRVar3;
  aom_release_frame_buffer_cb_fn_t p_Var4;
  void *cb_priv;
  aom_get_frame_buffer_cb_fn_t cb;
  int iVar5;
  long lVar6;
  int i;
  aom_codec_frame_buffer_t *fb;
  ulong uVar7;
  uint num_planes;
  YV12_BUFFER_CONFIG local_100;
  
  pSVar2 = cm->seq_params;
  uVar1 = pSVar2->monochrome;
  iVar5 = cm->width;
  if (iVar5 != cm->superres_upscaled_width) {
    byte_alignment = (cm->features).byte_alignment;
    memset(&local_100,0,0xd0);
    pRVar3 = cm->cur_frame;
    src_bc = &pRVar3->buf;
    iVar5 = aom_alloc_frame_buffer
                      (&local_100,iVar5 + 7U & 0xfffffff8,cm->height,pSVar2->subsampling_x,
                       pSVar2->subsampling_y,(uint)pSVar2->use_highbitdepth,0x120,byte_alignment,
                       false,0);
    if (iVar5 != 0) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate copy buffer for superres upscaling");
    }
    aom_yv12_copy_frame_c(src_bc,&local_100,(uint)(uVar1 == '\0') * 2 + 1);
    if (pool == (BufferPool *)0x0) {
      local_100.bit_depth = (pRVar3->buf).bit_depth;
      local_100.color_primaries = (pRVar3->buf).color_primaries;
      local_100.transfer_characteristics = (pRVar3->buf).transfer_characteristics;
      local_100.matrix_coefficients = (pRVar3->buf).matrix_coefficients;
      local_100.monochrome = (pRVar3->buf).monochrome;
      local_100.chroma_sample_position = (pRVar3->buf).chroma_sample_position;
      local_100.color_range = (pRVar3->buf).color_range;
      iVar5 = aom_alloc_frame_buffer
                        (src_bc,cm->superres_upscaled_width,cm->superres_upscaled_height,
                         pSVar2->subsampling_x,pSVar2->subsampling_y,(uint)pSVar2->use_highbitdepth,
                         0x120,byte_alignment,alloc_pyramid,0);
      if (iVar5 != 0) {
        aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                           "Failed to reallocate current frame buffer for superres upscaling");
      }
      (pRVar3->buf).bit_depth = local_100.bit_depth;
      (pRVar3->buf).color_primaries = local_100.color_primaries;
      (pRVar3->buf).transfer_characteristics = local_100.transfer_characteristics;
      (pRVar3->buf).matrix_coefficients = local_100.matrix_coefficients;
      (pRVar3->buf).monochrome = local_100.monochrome;
      (pRVar3->buf).chroma_sample_position = local_100.chroma_sample_position;
      (pRVar3->buf).color_range = local_100.color_range;
    }
    else {
      fb = &cm->cur_frame->raw_frame_buffer;
      p_Var4 = pool->release_fb_cb;
      cb_priv = pool->cb_priv;
      cb = pool->get_fb_cb;
      pthread_mutex_lock((pthread_mutex_t *)pool);
      iVar5 = (*p_Var4)(cb_priv,fb);
      if (iVar5 != 0) {
        pthread_mutex_unlock((pthread_mutex_t *)pool);
        aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                           "Failed to free current frame buffer before superres upscaling");
      }
      iVar5 = aom_realloc_frame_buffer
                        (src_bc,cm->superres_upscaled_width,cm->superres_upscaled_height,
                         pSVar2->subsampling_x,pSVar2->subsampling_y,(uint)pSVar2->use_highbitdepth,
                         0x120,byte_alignment,fb,cb,cb_priv,alloc_pyramid,0);
      if (iVar5 != 0) {
        pthread_mutex_unlock((pthread_mutex_t *)pool);
        aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate current frame buffer for superres upscaling");
      }
      pthread_mutex_unlock((pthread_mutex_t *)pool);
    }
    num_planes = (uint)(cm->seq_params->monochrome == '\0') * 2 + 1;
    uVar7 = 0;
    do {
      lVar6 = (ulong)(uVar7 != 0) * 4;
      av1_upscale_normative_rows
                (cm,*(uint8_t **)((long)local_100.store_buf_adr + uVar7 * 8 + 0xffffffffffffffe0),
                 *(int *)((long)local_100.store_buf_adr + lVar6 + 0xffffffffffffffd8U),
                 (pRVar3->buf).store_buf_adr[uVar7 - 4],
                 *(int *)((long)(pRVar3->buf).store_buf_adr + lVar6 + -0x28),(int)uVar7,
                 *(int *)((long)local_100.store_buf_adr + lVar6 + 0xffffffffffffffd0U));
      uVar7 = uVar7 + 1;
    } while (num_planes != uVar7);
    aom_extend_frame_borders_c(src_bc,num_planes);
    aom_free_frame_buffer(&local_100);
  }
  return;
}

Assistant:

void av1_superres_upscale(AV1_COMMON *cm, BufferPool *const pool,
                          bool alloc_pyramid) {
  const int num_planes = av1_num_planes(cm);
  if (!av1_superres_scaled(cm)) return;
  const SequenceHeader *const seq_params = cm->seq_params;
  const int byte_alignment = cm->features.byte_alignment;

  YV12_BUFFER_CONFIG copy_buffer;
  memset(&copy_buffer, 0, sizeof(copy_buffer));

  YV12_BUFFER_CONFIG *const frame_to_show = &cm->cur_frame->buf;

  const int aligned_width = ALIGN_POWER_OF_TWO(cm->width, 3);
  if (aom_alloc_frame_buffer(
          &copy_buffer, aligned_width, cm->height, seq_params->subsampling_x,
          seq_params->subsampling_y, seq_params->use_highbitdepth,
          AOM_BORDER_IN_PIXELS, byte_alignment, false, 0))
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate copy buffer for superres upscaling");

  // Copy function assumes the frames are the same size.
  // Note that it does not copy YV12_BUFFER_CONFIG config data.
  aom_yv12_copy_frame(frame_to_show, &copy_buffer, num_planes);

  assert(copy_buffer.y_crop_width == aligned_width);
  assert(copy_buffer.y_crop_height == cm->height);

  // Realloc the current frame buffer at a higher resolution in place.
  if (pool != NULL) {
    // Use callbacks if on the decoder.
    aom_codec_frame_buffer_t *fb = &cm->cur_frame->raw_frame_buffer;
    aom_release_frame_buffer_cb_fn_t release_fb_cb = pool->release_fb_cb;
    aom_get_frame_buffer_cb_fn_t cb = pool->get_fb_cb;
    void *cb_priv = pool->cb_priv;

    lock_buffer_pool(pool);
    // Realloc with callback does not release the frame buffer - release first.
    if (release_fb_cb(cb_priv, fb)) {
      unlock_buffer_pool(pool);
      aom_internal_error(
          cm->error, AOM_CODEC_MEM_ERROR,
          "Failed to free current frame buffer before superres upscaling");
    }
    // aom_realloc_frame_buffer() leaves config data for frame_to_show intact
    if (aom_realloc_frame_buffer(
            frame_to_show, cm->superres_upscaled_width,
            cm->superres_upscaled_height, seq_params->subsampling_x,
            seq_params->subsampling_y, seq_params->use_highbitdepth,
            AOM_BORDER_IN_PIXELS, byte_alignment, fb, cb, cb_priv,
            alloc_pyramid, 0)) {
      unlock_buffer_pool(pool);
      aom_internal_error(
          cm->error, AOM_CODEC_MEM_ERROR,
          "Failed to allocate current frame buffer for superres upscaling");
    }
    unlock_buffer_pool(pool);
  } else {
    // Make a copy of the config data for frame_to_show in copy_buffer
    copy_buffer_config(frame_to_show, &copy_buffer);

    // Don't use callbacks on the encoder.
    // aom_alloc_frame_buffer() clears the config data for frame_to_show
    if (aom_alloc_frame_buffer(
            frame_to_show, cm->superres_upscaled_width,
            cm->superres_upscaled_height, seq_params->subsampling_x,
            seq_params->subsampling_y, seq_params->use_highbitdepth,
            AOM_BORDER_IN_PIXELS, byte_alignment, alloc_pyramid, 0))
      aom_internal_error(
          cm->error, AOM_CODEC_MEM_ERROR,
          "Failed to reallocate current frame buffer for superres upscaling");

    // Restore config data back to frame_to_show
    copy_buffer_config(&copy_buffer, frame_to_show);
  }
  // TODO(afergs): verify frame_to_show is correct after realloc
  //               encoder:
  //               decoder:

  assert(frame_to_show->y_crop_width == cm->superres_upscaled_width);
  assert(frame_to_show->y_crop_height == cm->superres_upscaled_height);

  // Scale up and back into frame_to_show.
  assert(frame_to_show->y_crop_width != cm->width);
  upscale_normative_and_extend_frame(cm, &copy_buffer, frame_to_show);

  // Free the copy buffer
  aom_free_frame_buffer(&copy_buffer);
}